

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileCollider.cpp
# Opt level: O3

Position __thiscall
solitaire::colliders::TableauPileCollider::getLastCardOrPilePosition(TableauPileCollider *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  Position PVar4;
  int extraout_var_00;
  
  iVar3 = (*(this->tableauPile->super_Archiver)._vptr_Archiver[7])();
  lVar1 = *(long *)CONCAT44(extraout_var,iVar3);
  lVar2 = ((long *)CONCAT44(extraout_var,iVar3))[1];
  if (lVar1 != lVar2) {
    PVar4.x = (*(this->super_TableauPileCollider)._vptr_TableauPileCollider[4])
                        (this,(ulong)((int)((ulong)(lVar2 - lVar1) >> 3) - 1));
    PVar4.y = extraout_var_00;
    return PVar4;
  }
  return this->position;
}

Assistant:

Position TableauPileCollider::getLastCardOrPilePosition() const {
    const auto& cards = tableauPile.getCards();
    if (cards.empty())
        return position;
    return getCardPosition(cards.size() - 1);
}